

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> * __thiscall
Catch::splitStringRef
          (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__return_storage_ptr__,
          Catch *this,StringRef str,char delimiter)

{
  ulong uVar1;
  Catch *pCVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  StringRef local_40;
  
  pcVar3 = str.m_start;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar5 = (char *)0x0;
  do {
    lVar4 = 0;
    pCVar2 = this;
    while( true ) {
      if ((long)pcVar5 - (long)pcVar3 == lVar4) {
        local_40.m_size = (long)pcVar3 - (long)pcVar5;
        if (pcVar5 <= pcVar3 && local_40.m_size != 0) {
          local_40.m_start = (char *)(this + (long)pcVar5);
          clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::
          emplace_back<Catch::StringRef>(__return_storage_ptr__,&local_40);
        }
        return __return_storage_ptr__;
      }
      if (pCVar2[(long)pcVar5] == str.m_size._0_1_) break;
      lVar4 = lVar4 + -1;
      pCVar2 = pCVar2 + 1;
    }
    uVar1 = -lVar4;
    if (1 < uVar1) {
      local_40.m_start = (char *)(this + (long)pcVar5);
      local_40.m_size = (long)pcVar3 - (long)pcVar5;
      if (pcVar3 < pcVar5 || local_40.m_size == 0) {
        local_40.m_start = "";
      }
      if (uVar1 <= local_40.m_size) {
        local_40.m_size = uVar1;
      }
      if (pcVar3 <= pcVar5) {
        local_40.m_size = 0;
      }
      clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::
      emplace_back<Catch::StringRef>(__return_storage_ptr__,&local_40);
    }
    pcVar5 = pcVar5 + (1 - lVar4);
  } while( true );
}

Assistant:

std::vector<StringRef> splitStringRef( StringRef str, char delimiter ) {
        std::vector<StringRef> subStrings;
        std::size_t start = 0;
        for(std::size_t pos = 0; pos < str.size(); ++pos ) {
            if( str[pos] == delimiter ) {
                if( pos - start > 1 )
                    subStrings.push_back( str.substr( start, pos-start ) );
                start = pos+1;
            }
        }
        if( start < str.size() )
            subStrings.push_back( str.substr( start, str.size()-start ) );
        return subStrings;
    }